

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O2

void __thiscall cppcms::impl::buddy_allocator::test_free(buddy_allocator *this)

{
  buddy_allocator *pbVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  buddy_allocator *pbVar4;
  uint uVar5;
  string local_1b0 [32];
  ostringstream oss;
  
  uVar5 = this->max_bit_size_;
  pbVar4 = this + 1;
  do {
    if ((int)uVar5 < 0) {
      pbVar1 = (buddy_allocator *)((long)this[1].free_list_ + this->memory_size_);
      if (pbVar1 < pbVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7c);
        std::operator<<(poVar2," p<= memory() + memory_size_");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,local_1b0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((long)pbVar1 - (long)pbVar4 < 0x20) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x7d);
      std::operator<<(poVar2," memory() + memory_size_ - p < int(alignment * 2)");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,local_1b0);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar1 = (buddy_allocator *)this->free_list_[uVar5];
    if (pbVar1 != (buddy_allocator *)0x0) {
      if (pbVar1 != pbVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x77);
        std::operator<<(poVar2," (char*)free_list_[i]==p");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,local_1b0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar5 != *(uint *)pbVar1->free_list_) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar2 = std::operator<<((ostream *)&oss,"Error ");
        poVar2 = std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/private/buddy_allocator.h"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x78);
        std::operator<<(poVar2," free_list_[i]->bits == i");
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar3,local_1b0);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pbVar4 = (buddy_allocator *)((long)pbVar4->free_list_ + (1L << ((byte)uVar5 & 0x3f)));
    }
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

char *memory()
	{
		return reinterpret_cast<char *>(this) + sizeof(*this);
	}